

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedValues.cpp
# Opt level: O0

unsigned_long
Maps::getMapKeyByValue<unsigned_long,TileSize>
          (map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
           *pairs,TileSize value)

{
  bool bVar1;
  reference ppVar2;
  undefined8 *puVar3;
  pair<const_unsigned_long,_TileSize> *pair;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
  *__range1;
  TileSize value_local;
  map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
  *pairs_local;
  
  __end0 = std::
           map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
           ::begin(pairs);
  pair = (pair<const_unsigned_long,_TileSize> *)
         std::
         map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
         ::end(pairs);
  while( true ) {
    bVar1 = std::operator==(&__end0,(_Self *)&pair);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "Exception : no key found in a map for a provided value";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_TileSize>_>::operator*
                       (&__end0);
    if (ppVar2->second == value) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_TileSize>_>::operator++(&__end0);
  }
  return ppVar2->first;
}

Assistant:

T Maps::getMapKeyByValue( const std::map<T, U>& pairs, U value )
{
    for ( auto& pair : pairs )
    {
        if ( pair.second == value )
        {
            return pair.first;
        }
    }
    throw "Exception : no key found in a map for a provided value";
}